

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O2

Var Js::RegexHelper::RegexEs6ReplaceImpl
              (ScriptContext *scriptContext,RecyclableObject *thisObj,JavascriptString *input,
              JavascriptString *replace,bool noResult)

{
  char16 cVar1;
  CharCount startIndex;
  Recycler *this;
  RecyclableObject *instance;
  code *pcVar2;
  undefined8 uVar3;
  bool bVar4;
  ushort uVar5;
  BOOL BVar6;
  charcount_t cVar7;
  CharCount base;
  charcount_t cVar8;
  uint uVar9;
  charcount_t cVar10;
  CharCount CVar11;
  CharCount startIndex_00;
  Recycler *pRVar12;
  List<Js::RecyclableObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  Var pvVar13;
  JavascriptString *pJVar14;
  TempArenaAllocatorObject *tempAllocator;
  int64 iVar15;
  WriteBarrierPtr<void> *buffer;
  JavascriptString *pJVar16;
  char16 *pcVar17;
  char16 *pcVar18;
  undefined4 *puVar19;
  ushort uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  uint uVar24;
  ScriptContext *input_00;
  ulong uVar25;
  PCWSTR varName;
  WriteBarrierPtr<void> *this_01;
  CharCount substringLength;
  ulong uVar26;
  undefined1 local_320 [8];
  Builder<256U> accumulatedResultBuilder;
  undefined1 local_d0 [8];
  TrackAllocData data_1;
  uint local_34;
  
  bVar4 = JavascriptRegExp::GetGlobalProperty(thisObj,scriptContext);
  if (bVar4) {
    JavascriptRegExp::GetUnicodeProperty(thisObj,scriptContext);
    JavascriptRegExp::SetLastIndexProperty(thisObj,&DAT_1000000000000,scriptContext);
  }
  this = scriptContext->recycler;
  local_320 = (undefined1  [8])
              &JsUtil::
               List<Js::RecyclableObject*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
               ::typeinfo;
  accumulatedResultBuilder.buffer[0] = (void *)0x0;
  accumulatedResultBuilder.buffer[1] = (void *)0xffffffffffffffff;
  accumulatedResultBuilder.buffer[2] = anon_var_dwarf_895d3b0;
  accumulatedResultBuilder.buffer[3]._0_4_ = 0x3fd;
  pRVar12 = Memory::Recycler::TrackAllocInfo(this,(TrackAllocData *)local_320);
  this_00 = (List<Js::RecyclableObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)new<Memory::Recycler>(0x30,pRVar12,0x37a1d4);
  (this_00->super_ReadOnlyList<Js::RecyclableObject_*,_Memory::Recycler,_DefaultComparer>).alloc =
       this;
  (this_00->super_ReadOnlyList<Js::RecyclableObject_*,_Memory::Recycler,_DefaultComparer>).
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_013d1470;
  (this_00->super_ReadOnlyList<Js::RecyclableObject_*,_Memory::Recycler,_DefaultComparer>).buffer.
  ptr = (WriteBarrierPtr<Js::RecyclableObject> *)0x0;
  (this_00->super_ReadOnlyList<Js::RecyclableObject_*,_Memory::Recycler,_DefaultComparer>).count = 0
  ;
  this_00->length = 0;
  this_00->increment = 4;
  while( true ) {
    pvVar13 = JavascriptRegExp::CallExec
                        (thisObj,input,L"RegExp.prototype[Symbol.replace]",scriptContext);
    BVar6 = JavascriptOperators::IsNull(pvVar13);
    if (BVar6 != 0) break;
    local_320 = (undefined1  [8])ExecResultToRecyclableObject(pvVar13);
    JsUtil::
    List<Js::RecyclableObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    Add(this_00,(RecyclableObject **)local_320);
    if (!bVar4) break;
    input_00 = scriptContext;
    pJVar14 = GetMatchStrFromResult((RecyclableObject *)local_320,scriptContext);
    AdvanceLastIndex(thisObj,(JavascriptString *)input_00,pJVar14,false,scriptContext);
  }
  CompoundString::Builder<256U>::Builder((Builder<256U> *)local_320,scriptContext);
  cVar7 = JavascriptString::GetLength(input);
  tempAllocator = ScriptContext::GetTemporaryAllocator(scriptContext,L"RegexHelper");
  local_34 = 0;
  buffer = (WriteBarrierPtr<void> *)0x0;
  lVar22 = 0;
  uVar23 = 0;
  do {
    if ((this_00->super_ReadOnlyList<Js::RecyclableObject_*,_Memory::Recycler,_DefaultComparer>).
        count <= lVar22) {
      ScriptContext::ReleaseTemporaryAllocator(scriptContext,tempAllocator);
      if (local_34 <= cVar7 && cVar7 - local_34 != 0) {
        CompoundString::Builder<256U>::Append
                  ((Builder<256U> *)local_320,input,local_34,cVar7 - local_34);
      }
      pJVar14 = CompoundString::Builder<256U>::ToString((Builder<256U> *)local_320);
      if (pJVar14 == (JavascriptString *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar19 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar19 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                    ,0x45f,"(accumulatedResult != nullptr)",
                                    "accumulatedResult != nullptr");
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar19 = 0;
      }
      return pJVar14;
    }
    instance = (this_00->
               super_ReadOnlyList<Js::RecyclableObject_*,_Memory::Recycler,_DefaultComparer>).buffer
               .ptr[lVar22].ptr;
    pvVar13 = JavascriptOperators::GetProperty(instance,0xd1,scriptContext,(PropertyValueInfo *)0x0)
    ;
    iVar15 = JavascriptConversion::ToLength(pvVar13,scriptContext);
    uVar25 = iVar15 - 1;
    if ((long)uVar25 < 1) {
      uVar25 = 0;
    }
    pJVar14 = GetMatchStrFromResult(instance,scriptContext);
    pvVar13 = JavascriptOperators::GetProperty
                        (instance,0x1da,scriptContext,(PropertyValueInfo *)0x0);
    iVar15 = JavascriptConversion::ToLength(pvVar13,scriptContext);
    base = JavascriptRegExp::GetIndexOrMax(iVar15);
    if (cVar7 <= base) {
      base = cVar7;
    }
    uVar21 = 99;
    if ((long)uVar25 < 99) {
      uVar21 = uVar25;
    }
    if (buffer == (WriteBarrierPtr<void> *)0x0) {
      local_d0 = (undefined1  [8])&Memory::WriteBarrierPtr<void>::typeinfo;
      data_1.typeinfo = (type_info *)0x0;
      data_1.count = (size_t)anon_var_dwarf_895d3b0;
      data_1.filename._0_4_ = 0x432;
      data_1.plusSize = uVar21 + 1;
      pRVar12 = Memory::Recycler::TrackAllocInfo(this,(TrackAllocData *)local_d0);
      buffer = Memory::AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<void>,false>
                         ((Memory *)pRVar12,(Recycler *)Memory::Recycler::Alloc,0,uVar21 + 1);
    }
    else if (uVar21 != uVar23) {
      buffer = (WriteBarrierPtr<void> *)
               Memory::Recycler::Realloc(this,buffer,uVar23 * 8 + 8,uVar21 * 8 + 8,true);
    }
    this_01 = buffer;
    for (uVar23 = 1; this_01 = this_01 + 1, uVar23 - uVar25 != 1; uVar23 = uVar23 + 1) {
      pJVar16 = (JavascriptString *)JavascriptOperators::GetItem(instance,uVar23,scriptContext);
      BVar6 = JavascriptOperators::IsUndefined(pJVar16);
      if (BVar6 == 0) {
        pJVar16 = JavascriptConversion::ToString(pJVar16,scriptContext);
      }
      if (uVar23 <= uVar21) {
        Memory::WriteBarrierPtr<void>::WriteBarrierSet(this_01,pJVar16);
      }
    }
    if (local_34 <= base) {
      CompoundString::Builder<256U>::Append
                ((Builder<256U> *)local_320,input,local_34,base - local_34);
      data_1.line = 0;
      data_1._36_4_ = 0;
      pcVar17 = JavascriptString::GetString(replace);
      cVar8 = JavascriptString::GetLength(replace);
      uVar9 = GetReplaceSubstitutions
                        (pcVar17,cVar8,&tempAllocator->allocator,(CharCount **)&data_1.line);
      cVar8 = JavascriptString::GetLength(pJVar14);
      pcVar17 = JavascriptString::GetString(pJVar14);
      uVar3 = data_1._32_8_;
      local_d0._4_4_ = cVar8;
      local_d0._0_4_ = base;
      accumulatedResultBuilder._544_8_ =
           (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
           super_JavascriptLibraryBase).undefinedValue.ptr;
      cVar8 = JavascriptString::GetLength(input);
      pcVar18 = JavascriptString::GetString(replace);
      cVar10 = JavascriptString::GetLength(replace);
      uVar25 = 0;
      uVar23 = (ulong)uVar9;
      if ((int)uVar9 < 1) {
        uVar23 = uVar25;
      }
      uVar26 = 0;
      for (; CVar11 = (CharCount)uVar26, uVar23 != uVar25; uVar25 = uVar25 + 1) {
        startIndex = *(CharCount *)(uVar3 + uVar25 * 4);
        CompoundString::Builder<256U>::Append
                  ((Builder<256U> *)local_320,replace,CVar11,startIndex - CVar11);
        uVar26 = (ulong)(startIndex + 1);
        cVar1 = pcVar18[uVar26];
        uVar5 = cVar1 + L'￐';
        if (uVar5 < 10) {
          uVar9 = startIndex + 2;
          uVar26 = (ulong)uVar9;
          if ((uVar9 < cVar10) && ((ushort)(pcVar18[uVar9] + L'￐') < 10)) {
            uVar20 = pcVar18[uVar9] + L'￐' + uVar5 * 10;
            uVar24 = startIndex + 3;
            if (uVar21 < uVar20) {
              uVar24 = uVar9;
              uVar20 = uVar5;
            }
            uVar5 = uVar20;
            uVar26 = (ulong)uVar24;
          }
          if (uVar5 == 0 || uVar21 < uVar5) {
            CompoundString::Builder<256U>::Append
                      ((Builder<256U> *)local_320,replace,startIndex,(int)uVar26 - startIndex);
          }
          else {
            pvVar13 = buffer[uVar5].ptr;
            bVar4 = VarIs<Js::JavascriptString>(pvVar13);
            if (bVar4) {
              pJVar16 = UnsafeVarTo<Js::JavascriptString>(pvVar13);
              CompoundString::Builder<256U>::Append((Builder<256U> *)local_320,pJVar16);
            }
            else if (pvVar13 != (Var)accumulatedResultBuilder._544_8_) {
              CompoundString::Builder<256U>::Append
                        ((Builder<256U> *)local_320,replace,startIndex,(int)uVar26 - startIndex);
            }
          }
        }
        else {
          if (cVar1 == L'`') {
            startIndex_00 = 0;
            CVar11 = local_d0._0_4_;
LAB_00bde4e2:
            CompoundString::Builder<256U>::Append
                      ((Builder<256U> *)local_320,input,startIndex_00,CVar11);
          }
          else if (cVar1 == L'&') {
            CompoundString::Builder<256U>::Append((Builder<256U> *)local_320,pcVar17,local_d0._4_4_)
            ;
          }
          else if (cVar1 == L'\'') {
            CVar11 = UnifiedRegex::GroupInfo::EndOffset((GroupInfo *)local_d0);
            if (CVar11 < cVar8) {
              startIndex_00 = UnifiedRegex::GroupInfo::EndOffset((GroupInfo *)local_d0);
              CVar11 = UnifiedRegex::GroupInfo::EndOffset((GroupInfo *)local_d0);
              CVar11 = cVar8 - CVar11;
              goto LAB_00bde4e2;
            }
          }
          else {
            if (cVar1 != L'$') {
              CompoundString::Builder<256U>::Append((Builder<256U> *)local_320,L'$');
              goto LAB_00bde4ee;
            }
            CompoundString::Builder<256U>::Append((Builder<256U> *)local_320,L'$');
          }
          uVar26 = (ulong)(startIndex + 2);
        }
LAB_00bde4ee:
      }
      CompoundString::Builder<256U>::Append
                ((Builder<256U> *)local_320,replace,CVar11,cVar10 - CVar11);
      cVar8 = JavascriptString::GetLength(pJVar14);
      local_34 = JavascriptRegExp::AddIndex(base,cVar8);
    }
    lVar22 = lVar22 + 1;
    uVar23 = uVar21;
  } while( true );
}

Assistant:

Var RegexHelper::RegexEs6ReplaceImpl(ScriptContext* scriptContext, RecyclableObject* thisObj, JavascriptString* input, JavascriptString* replace, bool noResult)
    {
        auto appendReplacement = [&](
            CompoundString::Builder<64 * sizeof(void *) / sizeof(char16)>& resultBuilder,
            ArenaAllocator* tempAlloc,
            JavascriptString* matchStr,
            int numberOfCaptures,
            Field(Var)* captures,
            CharCount position)
        {
            CharCount* substitutionOffsets = nullptr;
            int substitutions = GetReplaceSubstitutions(
                replace->GetString(),
                replace->GetLength(),
                tempAlloc,
                &substitutionOffsets);
            auto getGroup = [&](int captureIndex, Var nonMatchValue) {
                return captureIndex <= numberOfCaptures ? PointerValue(captures[captureIndex]) : nonMatchValue;
            };
            UnifiedRegex::GroupInfo match(position, matchStr->GetLength());
            int numGroups = numberOfCaptures + 1; // Take group 0 into account.
            ReplaceFormatString(
                scriptContext,
                numGroups,
                getGroup,
                input,
                matchStr->GetString(),
                match,
                replace,
                substitutions,
                substitutionOffsets,
                resultBuilder);
        };
        return RegexEs6ReplaceImpl(scriptContext, thisObj, input, appendReplacement, noResult);
    }